

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsumst.hpp
# Opt level: O1

void __thiscall
soplex::SPxSumST<double>::setupWeights(SPxSumST<double> *this,SPxSolverBase<double> *base)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  Item *pIVar6;
  DataKey *pDVar7;
  bool bVar8;
  double *pdVar9;
  pointer __s;
  pointer pdVar10;
  SPxVectorST<double> *this_00;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int *piVar16;
  Item *pIVar17;
  long lVar18;
  Nonzero<double> *pNVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  VectorBase<double> delta;
  VectorBase<double> work;
  VectorBase<double> rowLen;
  iterator __end0;
  int dimen;
  VectorBase<double> local_d8;
  VectorBase<double> local_b8;
  VectorBase<double> local_98;
  SPxSolverBase<double> *local_78;
  SPxVectorST<double> *local_70;
  size_t local_68;
  long local_60;
  pointer local_58;
  ulong local_50;
  ulong local_48;
  pointer local_40;
  ulong local_38;
  
  local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  VectorBase<double>::reDim
            (&local_98,
             (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             thenum,true);
  VectorBase<double>::reDim
            (&local_b8,
             (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum,true);
  VectorBase<double>::reDim
            (&local_d8,
             (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum,true);
  pdVar10 = local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  __s = local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  pdVar3 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar4 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_40 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  pdVar5 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar1 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum;
  lVar13 = (long)iVar1;
  if (0 < lVar13) {
    pIVar6 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             theitem;
    pDVar7 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             thekey;
    lVar12 = lVar13;
    do {
      pIVar17 = pIVar6 + pDVar7[lVar12 + -1].idx;
      uVar23 = (pIVar17->data).super_SVectorBase<double>.memused;
      uVar14 = (ulong)uVar23;
      dVar25 = 0.0;
      if (uVar14 != 0) {
        pNVar19 = (pIVar17->data).super_SVectorBase<double>.m_elem;
        uVar11 = uVar14;
        do {
          pdVar9 = &pNVar19->val;
          pNVar19 = pNVar19 + 1;
          dVar25 = dVar25 + *pdVar9 * *pdVar9;
          uVar20 = (int)uVar11 - 1;
          uVar11 = (ulong)uVar20;
        } while (uVar20 != 0);
      }
      lVar15 = lVar12 + -1;
      local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar15] = dVar25;
      dVar24 = pdVar3[lVar15];
      if (dVar24 <= 0.0) {
        dVar24 = pdVar4[lVar15];
        if ((dVar24 < 0.0) && (0 < (int)uVar23)) {
          lVar22 = uVar14 + 1;
          piVar16 = &(pIVar17->data).super_SVectorBase<double>.m_elem[uVar14 - 1].idx;
          do {
            local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[*piVar16] =
                 ((Nonzero<double> *)(piVar16 + -2))->val * (dVar24 / dVar25) +
                 local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[*piVar16];
            lVar22 = lVar22 + -1;
            piVar16 = piVar16 + -4;
          } while (1 < lVar22);
        }
      }
      else if (0 < (int)uVar23) {
        lVar22 = uVar14 + 1;
        piVar16 = &(pIVar17->data).super_SVectorBase<double>.m_elem[uVar14 - 1].idx;
        do {
          local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[*piVar16] =
               ((Nonzero<double> *)(piVar16 + -2))->val * (dVar24 / dVar25) +
               local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[*piVar16];
          lVar22 = lVar22 + -1;
          piVar16 = piVar16 + -4;
        } while (1 < lVar22);
      }
      bVar8 = 1 < lVar12;
      lVar12 = lVar15;
    } while (bVar8);
  }
  local_48 = (ulong)((long)local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3;
  local_50 = (ulong)(uint)(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                          super_SVSetBase<double>.set.thenum;
  uVar23 = (uint)local_48;
  local_58 = local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_68 = (long)local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start & 0xfffffffffffffff8;
  pIVar6 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
           theitem;
  pDVar7 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
           thekey;
  local_60 = local_50 + 1;
  uVar14 = 0;
  local_78 = base;
  local_70 = &this->super_SPxVectorST<double>;
  while( true ) {
    this_00 = local_70;
    if (0 < (int)local_48) {
      uVar11 = 0;
      do {
        pdVar10[uVar11] = __s[uVar11] + pdVar10[uVar11];
        uVar11 = uVar11 + 1;
      } while ((uVar23 & 0x7fffffff) != uVar11);
    }
    lVar12 = local_60;
    if (0 < (int)local_50) {
      do {
        if (local_40[lVar12 + -2] < pdVar10[lVar12 + -2]) {
          pdVar10[lVar12 + -2] = local_40[lVar12 + -2];
        }
        dVar25 = pdVar5[lVar12 + -2];
        if (pdVar10[lVar12 + -2] <= dVar25 && dVar25 != pdVar10[lVar12 + -2]) {
          pdVar10[lVar12 + -2] = dVar25;
        }
        lVar12 = lVar12 + -1;
      } while (1 < lVar12);
    }
    if ((int)uVar14 == 0xc) break;
    local_38 = uVar14;
    if (__s != local_58) {
      memset(__s,0,local_68);
    }
    lVar12 = lVar13;
    if (0 < iVar1) {
      do {
        pIVar17 = pIVar6 + pDVar7[lVar12 + -1].idx;
        iVar2 = (pIVar17->data).super_SVectorBase<double>.memused;
        lVar15 = (long)iVar2;
        if (lVar15 < 1) {
          dVar25 = 0.0;
        }
        else {
          pNVar19 = (pIVar17->data).super_SVectorBase<double>.m_elem;
          iVar21 = iVar2 + 1;
          dVar26 = 0.0;
          dVar24 = 0.0;
          do {
            dVar27 = pNVar19->val * pdVar10[pNVar19->idx];
            dVar25 = dVar24 + dVar27;
            dVar26 = dVar26 + (dVar27 - (dVar25 - dVar24)) + (dVar24 - (dVar25 - (dVar25 - dVar24)))
            ;
            pNVar19 = pNVar19 + 1;
            iVar21 = iVar21 + -1;
            dVar24 = dVar25;
          } while (1 < iVar21);
          dVar25 = dVar25 + dVar26;
        }
        lVar22 = lVar12 + -1;
        dVar24 = pdVar3[lVar22];
        if (dVar24 <= dVar25) {
          dVar24 = pdVar4[lVar22];
          if ((dVar24 < dVar25) && (0 < iVar2)) {
            dVar26 = local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar22];
            lVar18 = lVar15 + 1;
            piVar16 = &(pIVar17->data).super_SVectorBase<double>.m_elem[lVar15 + -1].idx;
            do {
              __s[*piVar16] =
                   ((Nonzero<double> *)(piVar16 + -2))->val * ((dVar24 - dVar25) / dVar26) +
                   __s[*piVar16];
              lVar18 = lVar18 + -1;
              piVar16 = piVar16 + -4;
            } while (1 < lVar18);
          }
        }
        else if (0 < iVar2) {
          dVar26 = local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar22];
          lVar18 = lVar15 + 1;
          piVar16 = &(pIVar17->data).super_SVectorBase<double>.m_elem[lVar15 + -1].idx;
          do {
            __s[*piVar16] =
                 ((Nonzero<double> *)(piVar16 + -2))->val * ((dVar24 - dVar25) / dVar26) +
                 __s[*piVar16];
            lVar18 = lVar18 + -1;
            piVar16 = piVar16 + -4;
          } while (1 < lVar18);
        }
        bVar8 = 1 < lVar12;
        lVar12 = lVar22;
      } while (bVar8);
    }
    uVar14 = (ulong)((int)local_38 + 1);
  }
  VectorBase<double>::operator=(&local_70->vec,&local_b8);
  this_00->state = PVEC;
  SPxVectorST<double>::setupWeights(this_00,local_78);
  if (local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxSumST<R>::setupWeights(SPxSolverBase<R>& base)
{
   int count;
   int i;
   R x;
   VectorBase<R> work, delta, rowLen;

   assert(base.nRows() > 0);
   assert(base.nCols() > 0);

   rowLen.reDim(base.nRows(), true);
   work.reDim(base.nCols(), true);
   delta.reDim(base.nCols(), true);

   R* wrk = work.get_ptr();
   const R* lhs = base.lhs().get_const_ptr();
   const R* rhs = base.rhs().get_const_ptr();
   const R* up = base.upper().get_const_ptr();
   const R* low = base.lower().get_const_ptr();

   for(i = base.nRows(); --i >= 0;)
   {
      rowLen[i] = base.rowVector(i).length2();

      if(lhs[i] > 0)
         delta.multAdd(lhs[i] / rowLen[i], base.rowVector(i));
      else if(rhs[i] < 0)
         delta.multAdd(rhs[i] / rowLen[i], base.rowVector(i));
   }

   for(count = 0;; count++)
   {
      work += delta;

      for(i = base.nCols(); --i >= 0;)
      {
         if(wrk[i] > up[i])
            wrk[i] = up[i];

         if(wrk[i] < low[i])
            wrk[i] = low[i];
      }

      //      std::cout << -(work * base.maxObj()) << std::endl;
      if(count >= 12)
         break;

      delta.clear();

      for(i = base.nRows(); --i >= 0;)
      {
         x = base.rowVector(i) * work;

         if(lhs[i] > x)
            delta.multAdd((lhs[i] - x) / rowLen[i], base.rowVector(i));
         else if(rhs[i] < x)
            delta.multAdd((rhs[i] - x) / rowLen[i], base.rowVector(i));
      }
   }

   this->primal(work);
   SPxVectorST<R>::setupWeights(base);
}